

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<ProKey,ProFunctionDef>::emplace<ProFunctionDef_const&>
          (QHash<ProKey,ProFunctionDef> *this,ProKey *key,ProFunctionDef *args)

{
  ProFile *pPVar1;
  long in_FS_OFFSET;
  piter pVar2;
  ProFunctionDef local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = *(ProFile **)this;
  if (pPVar1 == (ProFile *)0x0) {
    local_38.m_pro = (ProFile *)0x0;
LAB_001fea90:
    QHash<ProKey,_ProFunctionDef>::detach((QHash<ProKey,_ProFunctionDef> *)this);
    pVar2 = (piter)emplace_helper<ProFunctionDef_const&>(this,key,args);
    QHash<ProKey,_ProFunctionDef>::~QHash((QHash<ProKey,_ProFunctionDef> *)&local_38);
  }
  else {
    if (1 < (uint)(pPVar1->m_refCount).m_cnt) {
      local_38.m_pro = pPVar1;
      if ((pPVar1->m_refCount).m_cnt != -1) {
        LOCK();
        (pPVar1->m_refCount).m_cnt = (pPVar1->m_refCount).m_cnt + 1;
        UNLOCK();
      }
      goto LAB_001fea90;
    }
    if ((pPVar1->m_proitems).d.d < (Data *)((ulong)(pPVar1->m_proitems).d.ptr >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<ProFunctionDef_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_001feb09;
    }
    local_38.m_pro = args->m_pro;
    local_38.m_offset = args->m_offset;
    ((local_38.m_pro)->m_refCount).m_cnt = ((local_38.m_pro)->m_refCount).m_cnt + 1;
    pVar2 = (piter)QHash<ProKey,_ProFunctionDef>::emplace_helper<ProFunctionDef>
                             ((QHash<ProKey,_ProFunctionDef> *)this,key,&local_38);
    ProFunctionDef::~ProFunctionDef(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_001feb09:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }